

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O2

void Omega_h::average_metric_contrib<2>(Tensor<2> *am,Int *n,Tensor<2> m,bool has_degen)

{
  Int j_1;
  double *pdVar1;
  undefined7 in_register_00000011;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  Vector<2> c_1;
  Matrix<2,_2> c;
  double local_c8 [4];
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if ((int)CONCAT71(in_register_00000011,has_degen) != 0) {
    pdVar1 = local_c8;
    local_c8[2] = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    local_c8[3] = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
    local_c8[0] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    local_c8[1] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    uVar4 = 0;
    uVar5 = 0;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        dVar6 = ABS(pdVar1[lVar3]);
        if (dVar6 <= (double)CONCAT44(uVar5,uVar4)) {
          dVar6 = (double)CONCAT44(uVar5,uVar4);
        }
        uVar4 = SUB84(dVar6,0);
        uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
      }
      pdVar1 = pdVar1 + 2;
    }
    if ((double)CONCAT44(uVar5,uVar4) <= 1e-10 && (double)CONCAT44(uVar5,uVar4) != 1e-10) {
      return;
    }
  }
  log_spd_old<2>(m);
  local_c8[2] = (double)local_28;
  local_c8[3] = (double)uStack_20;
  local_c8[0] = local_38;
  local_c8[1] = (double)uStack_30;
  local_68 = (am->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_[0];
  dStack_60 = (am->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_[1];
  local_78 = (am->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_[0];
  dStack_70 = (am->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_[1];
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    local_98 = local_c8[lVar2 * 2 + 10];
    dStack_90 = local_c8[lVar2 * 2 + 0xb];
    local_a8 = local_c8[lVar2 * 2];
    dStack_a0 = local_c8[lVar2 * 2 + 1];
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      local_c8[lVar3 + 8] = local_c8[lVar3 + 6] + local_c8[lVar3 + 4];
    }
    local_c8[lVar2 * 2 + 0xe] = local_88;
    local_c8[lVar2 * 2 + 0xf] = dStack_80;
  }
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_[0] = local_48;
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_[1] = dStack_40;
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_[0] = local_58;
  (am->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_[1] = dStack_50;
  *n = *n + 1;
  return;
}

Assistant:

OMEGA_H_INLINE_BIG void average_metric_contrib(
    Tensor<dim>& am, Int& n, Tensor<dim> const m, bool const has_degen) {
  if (has_degen && max_norm(m) < OMEGA_H_EPSILON) return;
  am += linearize_metric(m);
  n++;
}